

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

void __thiscall QProcess::setChildProcessModifier(QProcess *this,function<void_()> *modifier)

{
  QObjectData *pQVar1;
  function<void_()> *this_00;
  
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  this_00 = (function<void_()> *)pQVar1[8]._vptr_QObjectData;
  if (this_00 == (function<void_()> *)0x0) {
    this_00 = (function<void_()> *)operator_new(0x40);
    *(_func_int **)&(this_00->super__Function_base)._M_functor = (_func_int *)0x0;
    *(_func_int **)((long)&(this_00->super__Function_base)._M_functor + 8) = (_func_int *)0x0;
    (this_00->super__Function_base)._M_manager = (_Manager_type)0x0;
    this_00->_M_invoker = (_Invoker_type)0x0;
    *(_func_int **)&this_00[1].super__Function_base._M_functor = (_func_int *)0x0;
    *(_func_int **)((long)&this_00[1].super__Function_base._M_functor + 8) = (_func_int *)0x0;
    this_00[1].super__Function_base._M_manager = (_Manager_type)0x0;
    this_00[1]._M_invoker = (_Invoker_type)0x0;
    pQVar1[8]._vptr_QObjectData = (_func_int **)this_00;
  }
  std::function<void_()>::operator=(this_00,modifier);
  return;
}

Assistant:

void QProcess::setChildProcessModifier(const std::function<void(void)> &modifier)
{
    Q_D(QProcess);
    if (!d->unixExtras)
        d->unixExtras.reset(new QProcessPrivate::UnixExtras);
    d->unixExtras->childProcessModifier = modifier;
}